

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void __thiscall ON_SubDHash::Dump(ON_SubDHash *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  wchar_t *pwVar6;
  ON_wString vsha1;
  ON_wString subdsha1;
  ON_TextLogIndent indent2;
  ON_TextLogIndent indent1;
  undefined1 auStack_78 [8];
  undefined1 local_70 [16];
  undefined8 uStack_60;
  undefined4 local_58;
  ON_TextLogIndent local_48;
  ON_TextLogIndent local_38;
  
  bVar4 = ON_TextLog::IsTextHash(text_log);
  if (!bVar4) {
    uVar5 = (ulong)(char)this->m_hash_type;
    if ((this->m_vertex_count == 0 || uVar5 == 0) || 3 < uVar5) {
      ON_TextLog::Print(text_log,"SubD hash: Empty\n");
      return;
    }
    ON_TextLog::Print(text_log,&DAT_006dd17c + *(int *)(&DAT_006dd178 + uVar5 * 4));
    ON_TextLogIndent::ON_TextLogIndent(&local_38,text_log);
    uVar1 = this->m_vertex_count;
    uVar2 = this->m_edge_count;
    uVar3 = this->m_face_count;
    SubDHash((ON_SHA1_Hash *)(local_70 + 8),this);
    ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)local_70,(bool)((char)local_70 + '\b'));
    pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_70);
    ON_TextLog::Print(text_log,L"SubD SHA1 = %ls\n",pwVar6);
    ON_TextLogIndent::ON_TextLogIndent(&local_48,text_log);
    if (uVar1 == 0) {
      ON_TextLog::Print(text_log,"No vertices.\n");
    }
    else {
      local_58 = *(undefined4 *)((this->m_vertex_hash).m_digest + 0x10);
      local_70._8_8_ = *(undefined8 *)(this->m_vertex_hash).m_digest;
      uStack_60 = *(undefined8 *)((this->m_vertex_hash).m_digest + 8);
      ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)auStack_78,(bool)((char)local_70 + '\b'));
      pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_78);
      ON_TextLog::Print(text_log,L"%u vertices. SHA1 = %ls\n",(ulong)uVar1,pwVar6);
      ON_wString::~ON_wString((ON_wString *)auStack_78);
    }
    if (uVar2 == 0) {
      ON_TextLog::Print(text_log,"No edges.\n");
    }
    else {
      local_58 = *(undefined4 *)((this->m_edge_hash).m_digest + 0x10);
      local_70._8_8_ = *(undefined8 *)(this->m_edge_hash).m_digest;
      uStack_60 = *(undefined8 *)((this->m_edge_hash).m_digest + 8);
      ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)auStack_78,(bool)((char)local_70 + '\b'));
      pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_78);
      ON_TextLog::Print(text_log,L"%u edges. SHA1 = %ls\n",(ulong)uVar2,pwVar6);
      ON_wString::~ON_wString((ON_wString *)auStack_78);
    }
    if (uVar3 == 0) {
      ON_TextLog::Print(text_log,"No faces.\n");
    }
    else {
      local_58 = *(undefined4 *)((this->m_face_hash).m_digest + 0x10);
      local_70._8_8_ = *(undefined8 *)(this->m_face_hash).m_digest;
      uStack_60 = *(undefined8 *)((this->m_face_hash).m_digest + 8);
      ON_SHA1_Hash::ToStringEx((ON_SHA1_Hash *)auStack_78,(bool)((char)local_70 + '\b'));
      pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_78);
      ON_TextLog::Print(text_log,L"%u faces. SHA1 = %ls\n",(ulong)uVar3,pwVar6);
      ON_wString::~ON_wString((ON_wString *)auStack_78);
    }
    ON_TextLogIndent::~ON_TextLogIndent(&local_48);
    ON_wString::~ON_wString((ON_wString *)local_70);
    ON_TextLogIndent::~ON_TextLogIndent(&local_38);
  }
  return;
}

Assistant:

void ON_SubDHash::Dump(ON_TextLog& text_log) const
{
  if (text_log.IsTextHash())
    return; 

  bool bIsNotEmpty = IsNotEmpty();

  if (bIsNotEmpty)
  {
    switch (this->HashType())
    {
    case ON_SubDHashType::Topology:
      text_log.Print("SubD toplogy hash:\n");
      break;
    case ON_SubDHashType::TopologyAndEdgeCreases:
      text_log.Print("SubD toplogy and edge creases hash:\n");
      break;
    case ON_SubDHashType::Geometry:
      text_log.Print("SubD geometry hash:\n");
      break;
    default:
      bIsNotEmpty = false;
      break;
    }
  }

  if (bIsNotEmpty)
  {
    const ON_TextLogIndent indent1(text_log);
    const unsigned vcount = this->VertexCount();
    const unsigned ecount = this->EdgeCount();
    const unsigned fcount = this->FaceCount();
    const ON_wString subdsha1 = this->SubDHash().ToStringEx(true);
    text_log.Print(L"SubD SHA1 = %ls\n", static_cast<const wchar_t*>(subdsha1));
    const ON_TextLogIndent indent2(text_log);
    if (vcount > 0)
    {
      const ON_wString vsha1 = this->VertexHash().ToStringEx(true);
      text_log.Print(L"%u vertices. SHA1 = %ls\n", vcount, static_cast<const wchar_t*>(vsha1));
    }
    else
      text_log.Print("No vertices.\n");

    if (ecount > 0)
    {
      const ON_wString esha1 = this->EdgeHash().ToStringEx(true);
      text_log.Print(L"%u edges. SHA1 = %ls\n", ecount, static_cast<const wchar_t*>(esha1));
    }
    else
      text_log.Print("No edges.\n");

    if (fcount > 0)
    {
      const ON_wString fsha1 = this->FaceHash().ToStringEx(true);
      text_log.Print(L"%u faces. SHA1 = %ls\n", fcount, static_cast<const wchar_t*>(fsha1));
    }
    else
      text_log.Print("No faces.\n");
  }
  else
    text_log.Print("SubD hash: Empty\n");
}